

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

void proc_pool_join(ProcPool *pool)

{
  int32_t iVar1;
  int local_1c;
  int local_14;
  int32_t idx;
  ProcPool *pool_local;
  
  do {
    iVar1 = pool_sync2(pool);
  } while (-1 < iVar1);
  local_14 = 0;
  while( true ) {
    if (pool->max_num_procs < 0x10) {
      local_1c = pool->max_num_procs;
    }
    else {
      local_1c = 0x10;
    }
    if (local_1c <= local_14) break;
    if ((pool->procs[local_14].valid & 1U) != 0) {
      proc_destroy(pool->procs + local_14);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void proc_pool_join(ProcPool *pool) {
    while ((pool_sync2(pool) >= 0)) {
    }

    // NOTE: Technically this loop is not necessary since `pool_sync` will take
    //       care of destroying terminated process. But we live it here for
    //       the sake of clarity
    for (int32_t idx = 0; idx < MIN(pool->max_num_procs, PROC_POOL_SIZE);
         idx++) {
        if (pool->procs[idx].valid) {
            proc_destroy(&pool->procs[idx]);
        }
    }
}